

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O1

void dynamic_api_suite::api_lower_bound(void)

{
  long lVar1;
  pair<int,_int> array [4];
  undefined8 *local_60;
  undefined8 local_58 [4];
  undefined8 *local_38;
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)local_58 + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  local_58[0] = 0x10000000b;
  local_60 = local_58;
  local_38 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(10)","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x75,"void dynamic_api_suite::api_lower_bound()",&local_60,&local_38);
  local_60 = local_58 + ((int)local_58[0] < 0xb);
  local_38 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(11)","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x76,"void dynamic_api_suite::api_lower_bound()",&local_60,&local_38);
  local_60 = local_58 + ((int)local_58[0] < 0xc);
  local_38 = local_58 + 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.lower_bound(12)","span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x77,"void dynamic_api_suite::api_lower_bound()",&local_60,&local_38);
  return;
}

Assistant:

void api_lower_bound()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    span.insert({ 11, 1 });
    BOOST_TEST_EQ(span.lower_bound(10), span.begin());
    BOOST_TEST_EQ(span.lower_bound(11), span.begin());
    BOOST_TEST_EQ(span.lower_bound(12), span.end());
}